

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 uVar2;
  undefined4 extraout_var;
  char *pcVar3;
  pair<bool,_const_char_*> pVar4;
  
  uVar2 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (lhs == (char *)0x0 && rhs == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = rhs;
    if ((lhs != (char *)0x0) && (pcVar3 = lhs, rhs != (char *)0x0)) {
      if (t - NumberMinType < 2) {
        pVar4 = consistentNumberProperty(lhs,rhs,t);
        return pVar4;
      }
      if (t != StringType) {
        if (t != BoolType) {
          __assert_fail("0 && \"Unreachable!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                        ,0x10a0,
                        "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                       );
        }
        __assert_fail("0 && \"consistentProperty for strings called with BoolType\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                      ,0x1098,
                      "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                     );
      }
      iVar1 = strcmp(lhs,rhs);
      pcVar3 = (char *)0x0;
      uVar2 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),iVar1 == 0);
      if (iVar1 == 0) {
        pcVar3 = lhs;
      }
    }
  }
  pVar4.second = pcVar3;
  pVar4._0_8_ = uVar2;
  return pVar4;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char *lhs,
                                                const char *rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs)
    {
    return std::make_pair(true, lhs);
    }
  if (!lhs)
    {
    return std::make_pair(true, rhs);
    }
  if (!rhs)
    {
    return std::make_pair(true, lhs);
    }

  const char* const null_ptr = 0;

  switch(t)
  {
  case BoolType:
    assert(0 && "consistentProperty for strings called with BoolType");
    return std::pair<bool, const char*>(false, null_ptr);
  case StringType:
    return consistentStringProperty(lhs, rhs);
  case NumberMinType:
  case NumberMaxType:
    return consistentNumberProperty(lhs, rhs, t);
  }
  assert(0 && "Unreachable!");
  return std::pair<bool, const char*>(false, null_ptr);
}